

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O2

void scalar_vis(t_gobj *z,_glist *owner,int vis)

{
  t_gobj *x;
  int iVar1;
  t_template *template;
  _glist *p_Var2;
  _parentwidgetbehavior *p_Var3;
  undefined4 extraout_var;
  _glist *x_00;
  _gobj **pp_Var4;
  t_float tVar5;
  t_float tVar6;
  t_float basey;
  t_float basex;
  t_float local_c0;
  t_float local_bc;
  char tag [128];
  
  template = template_findbyname((t_symbol *)z[1].g_pd);
  p_Var2 = template_findcanvas(template);
  scalar_getbasexy((t_scalar *)z,&basex,&basey);
  if (p_Var2 != (_glist *)0x0) {
    local_bc = basex;
    local_c0 = basey;
    pp_Var4 = &p_Var2->gl_list;
    while (x = *pp_Var4, x != (t_gobj *)0x0) {
      p_Var3 = pd_getparentwidget(&x->g_pd);
      if (p_Var3 != (_parentwidgetbehavior *)0x0) {
        (*p_Var3->w_parentvisfn)(x,owner,(t_word *)&z[1].g_next,template,local_bc,local_c0,vis);
      }
      pp_Var4 = &x->g_next;
    }
    iVar1 = glist_isselected(owner,z);
    if (iVar1 != 0) {
      scalar_drawselectrect((t_scalar *)z,owner,0);
      scalar_drawselectrect((t_scalar *)z,owner,1);
    }
    sys_unqueuegui(z);
    return;
  }
  iVar1 = sprintf(tag,"scalar%lx",z);
  if (vis == 0) {
    p_Var2 = glist_getcanvas((_glist *)CONCAT44(extraout_var,iVar1));
    pdgui_vmess((char *)0x0,"crs",p_Var2,"delete",tag);
  }
  else {
    tVar5 = glist_xtopixels(owner,basex);
    tVar6 = glist_ytopixels(owner,basey);
    p_Var2 = glist_getcanvas(x_00);
    pdgui_vmess((char *)0x0,"crr iiii rs",p_Var2,"create","rectangle",(ulong)((int)tVar5 - 1),
                (ulong)((int)tVar6 - 1),(ulong)((int)tVar5 + 1),(ulong)((int)tVar6 + 1),"-tags",tag)
    ;
  }
  return;
}

Assistant:

static void scalar_vis(t_gobj *z, t_glist *owner, int vis)
{
    t_scalar *x = (t_scalar *)z;
    t_template *template = template_findbyname(x->sc_template);
    t_canvas *templatecanvas = template_findcanvas(template);
    t_gobj *y;
    t_float basex, basey;
    scalar_getbasexy(x, &basex, &basey);
        /* if we don't know how to draw it, make a small rectangle */
    if (!templatecanvas)
    {
        char tag[128];
        sprintf(tag, "scalar%lx", x);

        if (vis)
        {
            int x1 = glist_xtopixels(owner, basex);
            int y1 = glist_ytopixels(owner, basey);
            pdgui_vmess(0, "crr iiii rs",
                      glist_getcanvas(owner),
                      "create", "rectangle",
                      x1-1,y1-1, x1+1,y1+1,
                      "-tags", tag);
        }
        else
            pdgui_vmess(0, "crs", glist_getcanvas(owner), "delete", tag);
        return;
    }

    for (y = templatecanvas->gl_list; y; y = y->g_next)
    {
        const t_parentwidgetbehavior *wb = pd_getparentwidget(&y->g_pd);
        if (!wb) continue;
        (*wb->w_parentvisfn)(y, owner, x->sc_vec, template, basex, basey, vis);
    }
    if (glist_isselected(owner, &x->sc_gobj))
    {
        scalar_drawselectrect(x, owner, 0);
        scalar_drawselectrect(x, owner, 1);
    }
    sys_unqueuegui(x);
}